

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O3

void __thiscall C3DFile::readPointSection(C3DFile *this,ifstream *datastream)

{
  vector<float,std::allocator<float>> *pvVar1;
  long *plVar2;
  iterator iVar3;
  iterator iVar4;
  pointer pvVar5;
  ushort uVar6;
  short sVar7;
  ulong uVar8;
  pointer pFVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  iterator __position;
  vector<FramePointInfo,std::allocator<FramePointInfo>> *this_00;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined1 auVar18 [16];
  vector<FramePointInfo,_std::allocator<FramePointInfo>_> frame_data;
  FloatMarkerData marker_data;
  value_type local_108;
  undefined1 local_e8 [4];
  float fStack_e4;
  undefined8 uStack_e0;
  pointer local_d8;
  pointer pfStack_d0;
  pointer local_c8;
  pointer pfStack_c0;
  pointer local_b8;
  pointer pfStack_b0;
  pointer local_a8;
  pointer puStack_a0;
  pointer local_98;
  pointer puStack_90;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  
  local_48 = getParamGeneric<float>(this,"POINT:SCALE",-1.0);
  local_58 = -local_48;
  uStack_54 = extraout_XMM0_Db ^ 0x80000000;
  uStack_50 = extraout_XMM0_Dc ^ 0x80000000;
  uStack_4c = extraout_XMM0_Dd ^ 0x80000000;
  this->uses_integer_data = local_58 <= local_48;
  uVar6 = getParamGeneric<short>(this,"POINT:DATA_START",-1);
  if ((short)uVar6 < 3) {
LAB_001074ce:
    __assert_fail("data_start > 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x12f,"void C3DFile::readPointSection(ifstream &)");
  }
  std::istream::seekg((long)datastream,(uint)uVar6 * 0x200 - 0x200);
  sVar7 = getParamGeneric<short>(this,"POINT:USED",-1);
  iVar10 = *(int *)&(this->header).last_frame;
  uVar6 = (this->header).first_frame;
  local_68 = (float)(int)sVar7;
  if (0 < sVar7) {
    uVar14 = (uint)local_68;
    do {
      local_88 = (pointer)0x0;
      puStack_80 = (pointer)0x0;
      local_98 = (pointer)0x0;
      puStack_90 = (pointer)0x0;
      local_a8 = (pointer)0x0;
      puStack_a0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      pfStack_b0 = (pointer)0x0;
      local_c8 = (pointer)0x0;
      pfStack_c0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      pfStack_d0 = (pointer)0x0;
      _local_e8 = (pointer)0x0;
      uStack_e0 = (pointer)0x0;
      local_78 = (pointer)0x0;
      std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::push_back
                (&this->float_point_data,(value_type *)local_e8);
      local_108.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
      ::push_back(&this->point_data,&local_108);
      if (local_108.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.
                        super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      if (puStack_a0 != (pointer)0x0) {
        operator_delete(puStack_a0,(long)puStack_90 - (long)puStack_a0);
      }
      if (local_b8 != (pointer)0x0) {
        operator_delete(local_b8,(long)local_a8 - (long)local_b8);
      }
      if (pfStack_d0 != (pointer)0x0) {
        operator_delete(pfStack_d0,(long)pfStack_c0 - (long)pfStack_d0);
      }
      if (_local_e8 != (pointer)0x0) {
        operator_delete(_local_e8,(long)local_d8 - (long)_local_e8);
      }
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  iVar10 = iVar10 + 1;
  if ((ushort)iVar10 != uVar6) {
    if (local_58 <= local_48) {
      local_58 = local_48;
    }
    uVar11 = iVar10 - (uint)uVar6;
    uVar14 = 1;
    if (1 < (ushort)uVar11) {
      uVar14 = uVar11;
    }
    uVar8 = (ulong)(uint)local_68;
    uVar11 = 0;
    local_68 = local_58;
    fStack_64 = local_58;
    fStack_60 = local_58;
    fStack_5c = local_58;
    do {
      if (0 < sVar7) {
        lVar16 = 0;
        lVar13 = 0;
        uVar15 = 0;
        do {
          if (this->uses_integer_data == false) {
            std::istream::read((char *)datastream,(long)local_e8);
            pFVar9 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar1 = (vector<float,std::allocator<float>> *)
                     ((long)&(pFVar9->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                     lVar13);
            iVar3._M_current =
                 *(float **)
                  ((long)&(pFVar9->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar13 + 8);
            if (iVar3._M_current ==
                *(float **)
                 ((long)&(pFVar9->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar1,iVar3,(float *)local_e8);
              pFVar9 = (this->float_point_data).
                       super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar3._M_current = (float)local_e8;
              *(float **)(pvVar1 + 8) = iVar3._M_current + 1;
            }
            iVar3._M_current =
                 *(float **)
                  ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar13 + 8);
            if (iVar3._M_current ==
                *(float **)
                 ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar13),iVar3,(float *)(local_e8 + 4));
              pFVar9 = (this->float_point_data).
                       super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar3._M_current = fStack_e4;
              *(float **)
               ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar13 + 8) = iVar3._M_current + 1;
            }
            iVar3._M_current =
                 *(float **)
                  ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar13 + 8);
            if (iVar3._M_current ==
                *(float **)
                 ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar13),iVar3,(float *)&uStack_e0);
              pFVar9 = (this->float_point_data).
                       super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar3._M_current = (float)uStack_e0;
              *(float **)
               ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar13 + 8) = iVar3._M_current + 1;
            }
            iVar4._M_current =
                 *(uchar **)
                  ((long)&(pFVar9->cameras).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar13 + 8);
            if (iVar4._M_current ==
                *(uchar **)
                 ((long)&(pFVar9->cameras).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar9->cameras).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar13),iVar4,(uchar *)((long)&uStack_e0 + 4));
            }
            else {
              *iVar4._M_current = uStack_e0._4_1_;
              plVar2 = (long *)((long)&(pFVar9->cameras).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar13 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pFVar9 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4._M_current =
                 *(uchar **)
                  ((long)&(pFVar9->residual).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar13 + 8);
            if (iVar4._M_current ==
                *(uchar **)
                 ((long)&(pFVar9->residual).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar9->residual).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar13),iVar4,(uchar *)((long)&uStack_e0 + 5));
            }
            else {
              *iVar4._M_current = uStack_e0._5_1_;
              plVar2 = (long *)((long)&(pFVar9->residual).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar13 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pvVar5 = (this->point_data).
                     super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar12 = ((long)(this->point_data).
                            super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                     -0x5555555555555555;
            if (uVar12 < uVar15 || uVar12 - uVar15 == 0) goto LAB_001074bd;
            this_00 = (vector<FramePointInfo,std::allocator<FramePointInfo>> *)
                      ((long)&(pvVar5->
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                              _M_impl.super__Vector_impl_data + lVar16);
            __position._M_current =
                 *(FramePointInfo **)
                  ((long)&(pvVar5->
                          super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                          _M_impl.super__Vector_impl_data + lVar16 + 8);
            if (__position._M_current !=
                *(FramePointInfo **)
                 ((long)&(pvVar5->
                         super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                         _M_impl.super__Vector_impl_data + lVar16 + 0x10)) goto LAB_00107447;
            std::vector<FramePointInfo,std::allocator<FramePointInfo>>::
            _M_realloc_insert<FramePointInfo_const&>(this_00,__position,(FramePointInfo *)local_e8);
          }
          else {
            std::istream::read((char *)datastream,(long)&local_108);
            auVar18 = pshuflw(ZEXT416((uint)local_108.
                                            super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start),
                              ZEXT416((uint)local_108.
                                            super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start),0x60);
            fVar17 = (float)(auVar18._0_4_ >> 0x10) * local_68;
            _local_e8 = (pointer)CONCAT44((float)(auVar18._4_4_ >> 0x10) * fStack_64,fVar17);
            uStack_e0._0_6_ =
                 CONCAT24(local_108.
                          super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start._6_2_,
                          (float)(int)local_108.
                                      super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_2_ * local_58);
            pFVar9 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar1 = (vector<float,std::allocator<float>> *)
                     ((long)&(pFVar9->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                     lVar13);
            iVar3._M_current =
                 *(float **)
                  ((long)&(pFVar9->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar13 + 8);
            if (iVar3._M_current ==
                *(float **)
                 ((long)&(pFVar9->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar1,iVar3,(float *)local_e8);
              pFVar9 = (this->float_point_data).
                       super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar3._M_current = fVar17;
              *(float **)(pvVar1 + 8) = iVar3._M_current + 1;
            }
            iVar3._M_current =
                 *(float **)
                  ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar13 + 8);
            if (iVar3._M_current ==
                *(float **)
                 ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar13),iVar3,(float *)(local_e8 + 4));
              pFVar9 = (this->float_point_data).
                       super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar3._M_current = fStack_e4;
              *(float **)
               ((long)&(pFVar9->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar13 + 8) = iVar3._M_current + 1;
            }
            iVar3._M_current =
                 *(float **)
                  ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar13 + 8);
            if (iVar3._M_current ==
                *(float **)
                 ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar13),iVar3,(float *)&uStack_e0);
              pFVar9 = (this->float_point_data).
                       super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl
                       .super__Vector_impl_data._M_start;
            }
            else {
              *iVar3._M_current = (float)uStack_e0;
              *(float **)
               ((long)&(pFVar9->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar13 + 8) = iVar3._M_current + 1;
            }
            iVar4._M_current =
                 *(uchar **)
                  ((long)&(pFVar9->cameras).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar13 + 8);
            if (iVar4._M_current ==
                *(uchar **)
                 ((long)&(pFVar9->cameras).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar9->cameras).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar13),iVar4,(uchar *)((long)&uStack_e0 + 4));
            }
            else {
              *iVar4._M_current = uStack_e0._4_1_;
              plVar2 = (long *)((long)&(pFVar9->cameras).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar13 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pFVar9 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4._M_current =
                 *(uchar **)
                  ((long)&(pFVar9->residual).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar13 + 8);
            if (iVar4._M_current ==
                *(uchar **)
                 ((long)&(pFVar9->residual).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar13 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar9->residual).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar13),iVar4,(uchar *)((long)&uStack_e0 + 5));
            }
            else {
              *iVar4._M_current = uStack_e0._5_1_;
              plVar2 = (long *)((long)&(pFVar9->residual).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar13 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pvVar5 = (this->point_data).
                     super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar12 = ((long)(this->point_data).
                            super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                     -0x5555555555555555;
            if (uVar12 < uVar15 || uVar12 - uVar15 == 0) {
LAB_001074bd:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar15);
              goto LAB_001074ce;
            }
            this_00 = (vector<FramePointInfo,std::allocator<FramePointInfo>> *)
                      ((long)&(pvVar5->
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                              _M_impl.super__Vector_impl_data + lVar16);
            __position._M_current =
                 *(FramePointInfo **)
                  ((long)&(pvVar5->
                          super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                          _M_impl.super__Vector_impl_data + lVar16 + 8);
            if (__position._M_current ==
                *(FramePointInfo **)
                 ((long)&(pvVar5->
                         super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                         _M_impl.super__Vector_impl_data + lVar16 + 0x10)) {
              std::vector<FramePointInfo,std::allocator<FramePointInfo>>::
              _M_realloc_insert<FramePointInfo_const&>
                        (this_00,__position,(FramePointInfo *)local_e8);
            }
            else {
LAB_00107447:
              *(pointer *)__position._M_current = _local_e8;
              *(pointer *)&(__position._M_current)->z = uStack_e0;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
            }
          }
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x78;
          lVar16 = lVar16 + 0x18;
        } while (uVar8 * 0x78 - lVar13 != 0);
      }
      std::istream::seekg((long)datastream,(uint)(this->header).analog_channels << 2);
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uVar14 & 0xffff));
  }
  return;
}

Assistant:

void C3DFile::readPointSection(ifstream &datastream) {
	float point_scale = getParamFloat("POINT:SCALE");

	//Check point scale value to figure out if the data is stored in integer or floating point format
	//if point_scale is negative the floating point format is used, other wise the integer format
	if (point_scale < 0.) {
		uses_integer_data = false;
		point_scale *= -1.;
	} else {
		uses_integer_data = true;
	}

	// compute the start of the point data
	int data_start = getParamSint16 ("POINT:DATA_START");
	data_start = 512 * ( data_start - 1);
		
	assert (data_start > 512);

	datastream.seekg(data_start, ios::beg);

	Sint16 point_count = getParamSint16("POINT:USED");

	Uint16 frame_count = header.last_frame - header.first_frame + 1;

	/*
	float video_frame_rate = header.video_sampling_rate;
	float analog_frame_rate = header.video_sampling_rate * header.analog_channels_samples;
	Uint16 analog_channel_count = header.analog_channels;

	cout << endl;
	cout << "Frame Count       = " << frame_count << endl;
	cout << "Video Frame Rate  = " << video_frame_rate << endl;
	cout << "Analog Frame Rate = " << analog_frame_rate << endl;
	cout << "Analog channels   = " << analog_channel_count / header.analog_channels_samples << endl;
	cout << endl;
	*/

	// Populate point_data
	int i;
	for (i = 0; i < point_count; i++) {
		FloatMarkerData marker_data;
		float_point_data.push_back(marker_data);
		std::vector<FramePointInfo> frame_data;
		point_data.push_back(frame_data);
	}

	unsigned int frame_index;

	for (frame_index = 0; frame_index < frame_count; frame_index ++) {
		// Read the frames
		for (i = 0; i < point_count; i++) {
			//read data from float data section
			if (!uses_integer_data) {
				FramePointInfo point_info;
				datastream.read(reinterpret_cast<char *>(&point_info), sizeof(FramePointInfo));

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			//read data from int data section
			} else {
				FramePointIntInfo int_point_info;
				datastream.read(reinterpret_cast<char *>(&int_point_info), sizeof(FramePointIntInfo));

				FramePointInfo point_info;
				point_info.x = point_scale * int_point_info.x;
				point_info.y = point_scale * int_point_info.y;
				point_info.z = point_scale * int_point_info.z;
				point_info.cameras = int_point_info.cameras;
				point_info.residual = int_point_info.residual;

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			}
		}

		datastream.seekg((header.analog_channels) * sizeof(float), ios::cur);
	}
}